

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::handle
          (AnalyzeVariableScopeAccessHandler *this,Op op,uint32_t *args,uint32_t length)

{
  Compiler *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  pointer ppVar5;
  mapped_type *pmVar6;
  Variant *this_00;
  size_type sVar7;
  SPIRType *pSVar8;
  mapped_type *pmVar9;
  SPIRExtension *pSVar10;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar11;
  uint local_310;
  uint local_30c;
  uint32_t i_10;
  uint32_t i_9;
  uint32_t i_8;
  uint32_t i_7;
  uint32_t i_6;
  uint32_t i_5;
  uint32_t local_2e8;
  uint32_t local_2e4 [5];
  uint32_t local_2d0;
  uint32_t local_2cc;
  _Node_iterator_base<unsigned_int,_false> local_2c8;
  undefined1 local_2c0;
  uint32_t local_2b8;
  uint32_t local_2b4;
  SPIRVariable *local_2b0;
  SPIRVariable *var_7;
  uint32_t ptr_3;
  GLSLstd450 op_450;
  uint32_t extension_set;
  uint32_t i_4;
  undefined1 local_290;
  uint32_t local_288;
  uint32_t local_284;
  _Node_iterator_base<unsigned_int,_false> local_280;
  undefined1 local_278;
  uint32_t local_270;
  uint32_t local_26c;
  SPIRVariable *local_268;
  SPIRVariable *var_6;
  _Node_iterator_base<unsigned_int,_false> _Stack_258;
  uint32_t i_3;
  undefined1 local_250;
  uint32_t local_248;
  uint32_t local_244;
  _Node_iterator_base<unsigned_int,_false> local_240;
  undefined1 local_238;
  uint32_t local_230;
  uint32_t local_22c;
  SPIRVariable *local_228;
  SPIRVariable *var_5;
  uint32_t i_2;
  SPIRType *local_208;
  SPIRType *type_1;
  undefined1 local_1f8;
  uint32_t local_1f0;
  uint32_t local_1ec;
  SPIRVariable *local_1e8;
  SPIRVariable *var_4;
  _Node_iterator_base<unsigned_int,_false> _Stack_1d8;
  uint32_t ptr_2;
  undefined1 local_1d0;
  _Node_iterator_base<unsigned_int,_false> local_1c8;
  undefined1 local_1c0;
  uint32_t local_1b8;
  uint32_t local_1b4;
  SPIRVariable *local_1b0;
  SPIRVariable *var_3;
  SPIRType *type;
  uint32_t local_18c;
  uint32_t local_188;
  uint local_184;
  _Node_iterator_base<unsigned_int,_false> _Stack_180;
  uint32_t i_1;
  undefined1 local_178;
  uint32_t local_170;
  uint32_t local_16c;
  _Node_iterator_base<unsigned_int,_false> local_168;
  undefined1 local_160;
  uint32_t local_158;
  uint32_t local_154;
  _Node_iterator_base<unsigned_int,_false> local_150;
  undefined1 local_148;
  uint32_t local_140;
  uint32_t local_13c;
  SPIRVariable *local_138;
  SPIRVariable *var_2;
  ID rhs;
  ID lhs;
  TypedID<(spirv_cross::Types)2> local_114;
  SPIRVariable *local_110;
  SPIRVariable *backing_variable;
  SPIRExpression *local_100;
  SPIRExpression *e;
  undefined1 local_f0;
  uint local_e4;
  _Node_iterator_base<unsigned_int,_false> _Stack_e0;
  uint32_t i;
  undefined1 local_d8;
  uint32_t local_cc;
  _Node_iterator_base<unsigned_int,_false> local_c8;
  undefined1 local_c0;
  uint32_t local_b8;
  uint32_t local_b4;
  SPIRVariable *local_b0;
  SPIRVariable *var_1;
  _Node_iterator_base<unsigned_int,_false> _Stack_a0;
  uint32_t ptr_1;
  undefined1 local_98;
  uint32_t local_90;
  uint32_t local_8c;
  _Node_iterator_base<unsigned_int,_false> local_88;
  undefined1 local_80;
  uint32_t local_78;
  uint32_t local_74;
  _Node_iterator_base<unsigned_int,_false> local_70;
  undefined1 local_68;
  uint32_t local_60;
  uint32_t local_5c;
  SPIRVariable *local_58;
  SPIRVariable *var;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_48;
  ID ptr;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_40;
  iterator itr;
  uint32_t local_30;
  uint32_t result_id;
  uint32_t result_type;
  uint32_t length_local;
  uint32_t *args_local;
  AnalyzeVariableScopeAccessHandler *pAStack_18;
  Op op_local;
  AnalyzeVariableScopeAccessHandler *this_local;
  
  local_30 = 0;
  itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ = 0
  ;
  result_id = length;
  _result_type = args;
  args_local._4_4_ = op;
  pAStack_18 = this;
  bVar2 = instruction_to_result_type
                    (this->compiler,&local_30,
                     (uint32_t *)
                     ((long)&itr.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur + 4),op,args,length);
  if (bVar2) {
    if (args_local._4_4_ == OpConvertUToAccelerationStructureKHR) {
      local_40._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find(&this->result_id_to_type,_result_type + 2);
      _Stack_48._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end(&this->result_id_to_type);
      bVar2 = ::std::__detail::operator!=(&local_40,&stack0xffffffffffffffb8);
      if (bVar2) {
        ppVar5 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_40);
        local_30 = ppVar5->second;
      }
    }
    uVar3 = local_30;
    pmVar6 = ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->result_id_to_type,
                          (key_type *)
                          ((long)&itr.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 4));
    *pmVar6 = uVar3;
  }
  switch(args_local._4_4_) {
  case OpLine:
  case OpNoLine:
    break;
  default:
    for (local_310 = 0; local_310 < result_id; local_310 = local_310 + 1) {
      uVar3 = _result_type[local_310];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpExtInst:
    for (op_450 = GLSLstd450FAbs; op_450 < result_id; op_450 = op_450 + GLSLstd450Round) {
      uVar3 = _result_type[op_450];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    ptr_3 = _result_type[2];
    pSVar10 = get<spirv_cross::SPIRExtension>(this->compiler,ptr_3);
    if ((*(int *)&(pSVar10->super_IVariant).field_0xc == 1) &&
       (var_7._4_4_ = _result_type[3], (var_7._4_4_ | 0x10) == 0x33)) {
      var_7._0_4_ = _result_type[5];
      local_2b0 = maybe_get_backing_variable(this->compiler,(uint32_t)var_7);
      if (local_2b0 != (SPIRVariable *)0x0) {
        local_2b4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_2b0->super_IVariant).self);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->accessed_variables_to_block,&local_2b4);
        local_2b8 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar11 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(pmVar9,&local_2b8);
        local_2c8._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_2c0 = pVar11.second;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_2b0->super_IVariant).self)
        ;
        if (uVar3 == (uint32_t)var_7) {
          local_2cc = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(local_2b0->super_IVariant).self);
          pmVar9 = ::std::
                   unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   ::operator[](&this->complete_write_variables_to_block,&local_2cc);
          local_2d0 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(this->current_block->super_IVariant).self);
          ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(pmVar9,&local_2d0);
        }
        else {
          local_2e4[0] = TypedID::operator_cast_to_unsigned_int
                                   ((TypedID *)&(local_2b0->super_IVariant).self);
          pmVar9 = ::std::
                   unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   ::operator[](&this->partial_write_variables_to_block,local_2e4);
          local_2e8 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(this->current_block->super_IVariant).self);
          ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(pmVar9,&local_2e8);
        }
      }
    }
    break;
  case OpFunctionCall:
    if (result_id < 3) {
      return false;
    }
    pCVar1 = this->compiler;
    TypedID<(spirv_cross::Types)1>::TypedID
              ((TypedID<(spirv_cross::Types)1> *)((long)&var_5 + 4),*_result_type);
    pSVar8 = get_type(pCVar1,var_5._4_4_);
    if (pSVar8->basetype != Void) {
      uVar3 = _result_type[1];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    result_id = result_id - 3;
    _result_type = _result_type + 3;
    for (var_5._0_4_ = 0; (uint)var_5 < result_id; var_5._0_4_ = (uint)var_5 + 1) {
      local_228 = maybe_get_backing_variable(this->compiler,_result_type[(uint)var_5]);
      if (local_228 != (SPIRVariable *)0x0) {
        local_22c = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_228->super_IVariant).self);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->accessed_variables_to_block,&local_22c);
        local_230 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar11 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(pmVar9,&local_230);
        local_240._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_238 = pVar11.second;
        local_244 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_228->super_IVariant).self);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,&local_244);
        local_248 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar11 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(pmVar9,&local_248);
        _Stack_258._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_250 = pVar11.second;
      }
      uVar3 = _result_type[(uint)var_5];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpLoad:
    if (result_id < 3) {
      return false;
    }
    var_4._4_4_ = _result_type[2];
    local_1e8 = maybe_get_backing_variable(this->compiler,var_4._4_4_);
    if (local_1e8 != (SPIRVariable *)0x0) {
      local_1ec = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_1e8->super_IVariant).self);
      pmVar9 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_1ec);
      local_1f0 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar11 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(pmVar9,&local_1f0);
      type_1 = (SPIRType *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_1f8 = pVar11.second;
    }
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    uVar3 = _result_type[2];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    local_208 = get<spirv_cross::SPIRType>(this->compiler,*_result_type);
    bVar2 = type_is_opaque_value(this->compiler,local_208);
    if (bVar2) {
      pmVar9 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->rvalue_forward_children,_result_type + 1);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(pmVar9,_result_type + 2);
    }
    break;
  case OpStore:
    if (result_id < 2) {
      return false;
    }
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)((long)&var + 4),*_result_type);
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&var + 4));
    local_58 = maybe_get_backing_variable(pCVar1,uVar3);
    if (local_58 != (SPIRVariable *)0x0) {
      local_5c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_58->super_IVariant).self)
      ;
      pmVar9 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_5c);
      local_60 = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar11 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(pmVar9,&local_60);
      local_70._M_cur =
           (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_68 = pVar11.second;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_58->super_IVariant).self);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&var + 4));
      if (uVar3 == uVar4) {
        local_74 = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&(local_58->super_IVariant).self);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->complete_write_variables_to_block,&local_74);
        local_78 = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar11 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(pmVar9,&local_78);
        local_88._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_80 = pVar11.second;
      }
      else {
        local_8c = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&(local_58->super_IVariant).self);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,&local_8c);
        local_90 = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar11 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(pmVar9,&local_90);
        _Stack_a0._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_98 = pVar11.second;
      }
    }
    uVar3 = *_result_type;
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpCopyMemory:
    if (result_id < 2) {
      return false;
    }
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)((long)&var_2 + 4),*_result_type);
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)&var_2,_result_type[1]);
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&var_2 + 4));
    local_138 = maybe_get_backing_variable(pCVar1,uVar3);
    if (local_138 != (SPIRVariable *)0x0) {
      local_13c = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_138->super_IVariant).self);
      pmVar9 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_13c);
      local_140 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar11 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(pmVar9,&local_140);
      local_150._M_cur =
           (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_148 = pVar11.second;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_138->super_IVariant).self);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&var_2 + 4));
      if (uVar3 == uVar4) {
        local_154 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_138->super_IVariant).self);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->complete_write_variables_to_block,&local_154);
        local_158 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar11 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(pmVar9,&local_158);
        local_168._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_160 = pVar11.second;
      }
      else {
        local_16c = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_138->super_IVariant).self);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,&local_16c);
        local_170 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar11 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(pmVar9,&local_170);
        _Stack_180._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_178 = pVar11.second;
      }
    }
    for (local_184 = 0; local_184 < 2; local_184 = local_184 + 1) {
      uVar3 = _result_type[local_184];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_2);
    local_138 = maybe_get_backing_variable(pCVar1,uVar3);
    if (local_138 != (SPIRVariable *)0x0) {
      local_188 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_138->super_IVariant).self);
      pmVar9 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_188);
      local_18c = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(this->current_block->super_IVariant).self);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(pmVar9,&local_18c);
    }
    break;
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
    if (result_id < 3) {
      return false;
    }
    var_1._4_4_ = _result_type[2];
    local_b0 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,var_1._4_4_);
    if (local_b0 != (SPIRVariable *)0x0) {
      local_b4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_b0->super_IVariant).self)
      ;
      pmVar9 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_b4);
      local_b8 = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar11 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(pmVar9,&local_b8);
      local_c8._M_cur =
           (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_c0 = pVar11.second;
      pmVar9 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->rvalue_forward_children,_result_type + 1);
      local_cc = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_b0->super_IVariant).self)
      ;
      pVar11 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(pmVar9,&local_cc);
      _Stack_e0._M_cur =
           (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_d8 = pVar11.second;
    }
    for (local_e4 = 2; local_e4 < result_id; local_e4 = local_e4 + 1) {
      uVar3 = _result_type[local_e4];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
      pmVar9 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->rvalue_forward_children,_result_type + 1);
      pVar11 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(pmVar9,_result_type + local_e4);
      e = (SPIRExpression *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_f0 = pVar11.second;
    }
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    backing_variable._7_1_ = 1;
    local_100 = set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int_const&,bool>
                          (this->compiler,_result_type[1],(char (*) [1])0x48ca95,_result_type,
                           (bool *)((long)&backing_variable + 7));
    local_110 = maybe_get_backing_variable(this->compiler,var_1._4_4_);
    if (local_110 == (SPIRVariable *)0x0) {
      TypedID<(spirv_cross::Types)2>::TypedID(&local_114,0);
    }
    else {
      TypedID<(spirv_cross::Types)2>::TypedID(&local_114,&(local_110->super_IVariant).self);
    }
    TypedID<(spirv_cross::Types)0>::operator=(&local_100->loaded_from,&local_114);
    this_00 = VectorView<spirv_cross::Variant>::operator[]
                        (&(this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>,
                         (ulong)_result_type[1]);
    Variant::set_allow_type_rewrite(this_00);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->access_chain_expressions,_result_type + 1);
    break;
  case OpArrayLength:
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpVectorShuffle:
  case OpCompositeInsert:
    for (i_7 = 1; i_7 < 4; i_7 = i_7 + 1) {
      uVar3 = _result_type[i_7];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpCompositeExtract:
    for (i_8 = 1; i_8 < 3; i_8 = i_8 + 1) {
      uVar3 = _result_type[i_8];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpCopyObject:
    var_3 = (SPIRVariable *)get<spirv_cross::SPIRType>(this->compiler,local_30);
    if ((((SPIRType *)var_3)->pointer & 1U) != 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&((SPIRType *)var_3)->parent_type);
      pmVar6 = ::std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->result_id_to_type,
                            (key_type *)
                            ((long)&itr.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                    ._M_cur + 4));
      *pmVar6 = uVar3;
    }
    if (result_id < 3) {
      return false;
    }
    local_1b0 = maybe_get_backing_variable(this->compiler,_result_type[2]);
    if (local_1b0 != (SPIRVariable *)0x0) {
      local_1b4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_1b0->super_IVariant).self);
      pmVar9 = ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_1b4);
      local_1b8 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(this->current_block->super_IVariant).self);
      pVar11 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(pmVar9,&local_1b8);
      local_1c8._M_cur =
           (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_1c0 = pVar11.second;
    }
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    sVar7 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->access_chain_expressions,_result_type + 2);
    if (sVar7 != 0) {
      pVar11 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(&this->access_chain_expressions,_result_type + 1);
      _Stack_1d8._M_cur =
           (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_1d0 = pVar11.second;
    }
    uVar3 = _result_type[2];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpImageSampleImplicitLod:
  case OpImageSampleExplicitLod:
  case OpImageSampleProjImplicitLod:
  case OpImageSampleProjExplicitLod:
  case OpImageFetch:
  case OpImageRead:
  case OpImageSparseSampleImplicitLod:
  case OpImageSparseSampleExplicitLod:
  case OpImageSparseSampleProjImplicitLod:
  case OpImageSparseSampleProjExplicitLod:
  case OpImageSparseFetch:
  case OpImageSparseRead:
    for (i_10 = 1; i_10 < result_id; i_10 = i_10 + 1) {
      if (i_10 != 4) {
        uVar3 = _result_type[i_10];
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->current_block->super_IVariant).self);
        notify_variable_access(this,uVar3,uVar4);
      }
    }
    break;
  case OpImageSampleDrefImplicitLod:
  case OpImageSampleDrefExplicitLod:
  case OpImageSampleProjDrefImplicitLod:
  case OpImageSampleProjDrefExplicitLod:
  case OpImageGather:
  case OpImageDrefGather:
  case OpImageSparseSampleDrefImplicitLod:
  case OpImageSparseSampleDrefExplicitLod:
  case OpImageSparseSampleProjDrefImplicitLod:
  case OpImageSparseSampleProjDrefExplicitLod:
  case OpImageSparseGather:
  case OpImageSparseDrefGather:
    for (local_30c = 1; local_30c < result_id; local_30c = local_30c + 1) {
      if (local_30c != 5) {
        uVar3 = _result_type[local_30c];
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->current_block->super_IVariant).self);
        notify_variable_access(this,uVar3,uVar4);
      }
    }
    break;
  case OpImageWrite:
    for (i_9 = 0; i_9 < result_id; i_9 = i_9 + 1) {
      if (i_9 != 3) {
        uVar3 = _result_type[i_9];
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->current_block->super_IVariant).self);
        notify_variable_access(this,uVar3,uVar4);
      }
    }
    break;
  case OpSelect:
    for (var_6._4_4_ = 1; var_6._4_4_ < result_id; var_6._4_4_ = var_6._4_4_ + 1) {
      if ((2 < var_6._4_4_) &&
         (local_268 = maybe_get_backing_variable(this->compiler,_result_type[var_6._4_4_]),
         local_268 != (SPIRVariable *)0x0)) {
        local_26c = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_268->super_IVariant).self);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->accessed_variables_to_block,&local_26c);
        local_270 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar11 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(pmVar9,&local_270);
        local_280._M_cur =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_278 = pVar11.second;
        local_284 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_268->super_IVariant).self);
        pmVar9 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,&local_284);
        local_288 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        pVar11 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(pmVar9,&local_288);
        _extension_set =
             (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_290 = pVar11.second;
      }
      uVar3 = _result_type[var_6._4_4_];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
  }
  return true;
}

Assistant:

bool Compiler::AnalyzeVariableScopeAccessHandler::handle(spv::Op op, const uint32_t *args, uint32_t length)
{
	// Keep track of the types of temporaries, so we can hoist them out as necessary.
	uint32_t result_type = 0, result_id = 0;
	if (compiler.instruction_to_result_type(result_type, result_id, op, args, length))
	{
		// For some opcodes, we will need to override the result id.
		// If we need to hoist the temporary, the temporary type is the input, not the result.
		if (op == OpConvertUToAccelerationStructureKHR)
		{
			auto itr = result_id_to_type.find(args[2]);
			if (itr != result_id_to_type.end())
				result_type = itr->second;
		}

		result_id_to_type[result_id] = result_type;
	}

	switch (op)
	{
	case OpStore:
	{
		if (length < 2)
			return false;

		ID ptr = args[0];
		auto *var = compiler.maybe_get_backing_variable(ptr);

		// If we store through an access chain, we have a partial write.
		if (var)
		{
			accessed_variables_to_block[var->self].insert(current_block->self);
			if (var->self == ptr)
				complete_write_variables_to_block[var->self].insert(current_block->self);
			else
				partial_write_variables_to_block[var->self].insert(current_block->self);
		}

		// args[0] might be an access chain we have to track use of.
		notify_variable_access(args[0], current_block->self);
		// Might try to store a Phi variable here.
		notify_variable_access(args[1], current_block->self);
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Access chains used in multiple blocks mean hoisting all the variables used to construct the access chain as not all backends can use pointers.
		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get<SPIRVariable>(ptr);
		if (var)
		{
			accessed_variables_to_block[var->self].insert(current_block->self);
			rvalue_forward_children[args[1]].insert(var->self);
		}

		// args[2] might be another access chain we have to track use of.
		for (uint32_t i = 2; i < length; i++)
		{
			notify_variable_access(args[i], current_block->self);
			rvalue_forward_children[args[1]].insert(args[i]);
		}

		// Also keep track of the access chain pointer itself.
		// In exceptionally rare cases, we can end up with a case where
		// the access chain is generated in the loop body, but is consumed in continue block.
		// This means we need complex loop workarounds, and we must detect this via CFG analysis.
		notify_variable_access(args[1], current_block->self);

		// The result of an access chain is a fixed expression and is not really considered a temporary.
		auto &e = compiler.set<SPIRExpression>(args[1], "", args[0], true);
		auto *backing_variable = compiler.maybe_get_backing_variable(ptr);
		e.loaded_from = backing_variable ? VariableID(backing_variable->self) : VariableID(0);

		// Other backends might use SPIRAccessChain for this later.
		compiler.ir.ids[args[1]].set_allow_type_rewrite();
		access_chain_expressions.insert(args[1]);
		break;
	}

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		ID lhs = args[0];
		ID rhs = args[1];
		auto *var = compiler.maybe_get_backing_variable(lhs);

		// If we store through an access chain, we have a partial write.
		if (var)
		{
			accessed_variables_to_block[var->self].insert(current_block->self);
			if (var->self == lhs)
				complete_write_variables_to_block[var->self].insert(current_block->self);
			else
				partial_write_variables_to_block[var->self].insert(current_block->self);
		}

		// args[0:1] might be access chains we have to track use of.
		for (uint32_t i = 0; i < 2; i++)
			notify_variable_access(args[i], current_block->self);

		var = compiler.maybe_get_backing_variable(rhs);
		if (var)
			accessed_variables_to_block[var->self].insert(current_block->self);
		break;
	}

	case OpCopyObject:
	{
		// OpCopyObject copies the underlying non-pointer type, 
		// so any temp variable should be declared using the underlying type.
		// If the type is a pointer, get its base type and overwrite the result type mapping.
		auto &type = compiler.get<SPIRType>(result_type);
		if (type.pointer)
			result_id_to_type[result_id] = type.parent_type;

		if (length < 3)
			return false;

		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (var)
			accessed_variables_to_block[var->self].insert(current_block->self);

		// Might be an access chain which we have to keep track of.
		notify_variable_access(args[1], current_block->self);
		if (access_chain_expressions.count(args[2]))
			access_chain_expressions.insert(args[1]);

		// Might try to copy a Phi variable here.
		notify_variable_access(args[2], current_block->self);
		break;
	}

	case OpLoad:
	{
		if (length < 3)
			return false;
		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get_backing_variable(ptr);
		if (var)
			accessed_variables_to_block[var->self].insert(current_block->self);

		// Loaded value is a temporary.
		notify_variable_access(args[1], current_block->self);

		// Might be an access chain we have to track use of.
		notify_variable_access(args[2], current_block->self);

		// If we're loading an opaque type we cannot lower it to a temporary,
		// we must defer access of args[2] until it's used.
		auto &type = compiler.get<SPIRType>(args[0]);
		if (compiler.type_is_opaque_value(type))
			rvalue_forward_children[args[1]].insert(args[2]);
		break;
	}

	case OpFunctionCall:
	{
		if (length < 3)
			return false;

		// Return value may be a temporary.
		if (compiler.get_type(args[0]).basetype != SPIRType::Void)
			notify_variable_access(args[1], current_block->self);

		length -= 3;
		args += 3;

		for (uint32_t i = 0; i < length; i++)
		{
			auto *var = compiler.maybe_get_backing_variable(args[i]);
			if (var)
			{
				accessed_variables_to_block[var->self].insert(current_block->self);
				// Assume we can get partial writes to this variable.
				partial_write_variables_to_block[var->self].insert(current_block->self);
			}

			// Cannot easily prove if argument we pass to a function is completely written.
			// Usually, functions write to a dummy variable,
			// which is then copied to in full to the real argument.

			// Might try to copy a Phi variable here.
			notify_variable_access(args[i], current_block->self);
		}
		break;
	}

	case OpSelect:
	{
		// In case of variable pointers, we might access a variable here.
		// We cannot prove anything about these accesses however.
		for (uint32_t i = 1; i < length; i++)
		{
			if (i >= 3)
			{
				auto *var = compiler.maybe_get_backing_variable(args[i]);
				if (var)
				{
					accessed_variables_to_block[var->self].insert(current_block->self);
					// Assume we can get partial writes to this variable.
					partial_write_variables_to_block[var->self].insert(current_block->self);
				}
			}

			// Might try to copy a Phi variable here.
			notify_variable_access(args[i], current_block->self);
		}
		break;
	}

	case OpExtInst:
	{
		for (uint32_t i = 4; i < length; i++)
			notify_variable_access(args[i], current_block->self);
		notify_variable_access(args[1], current_block->self);

		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450Modf:
			case GLSLstd450Frexp:
			{
				uint32_t ptr = args[5];
				auto *var = compiler.maybe_get_backing_variable(ptr);
				if (var)
				{
					accessed_variables_to_block[var->self].insert(current_block->self);
					if (var->self == ptr)
						complete_write_variables_to_block[var->self].insert(current_block->self);
					else
						partial_write_variables_to_block[var->self].insert(current_block->self);
				}
				break;
			}

			default:
				break;
			}
		}
		break;
	}

	case OpArrayLength:
		// Only result is a temporary.
		notify_variable_access(args[1], current_block->self);
		break;

	case OpLine:
	case OpNoLine:
		// Uses literals, but cannot be a phi variable or temporary, so ignore.
		break;

		// Atomics shouldn't be able to access function-local variables.
		// Some GLSL builtins access a pointer.

	case OpCompositeInsert:
	case OpVectorShuffle:
		// Specialize for opcode which contains literals.
		for (uint32_t i = 1; i < 4; i++)
			notify_variable_access(args[i], current_block->self);
		break;

	case OpCompositeExtract:
		// Specialize for opcode which contains literals.
		for (uint32_t i = 1; i < 3; i++)
			notify_variable_access(args[i], current_block->self);
		break;

	case OpImageWrite:
		for (uint32_t i = 0; i < length; i++)
		{
			// Argument 3 is a literal.
			if (i != 3)
				notify_variable_access(args[i], current_block->self);
		}
		break;

	case OpImageSampleImplicitLod:
	case OpImageSampleExplicitLod:
	case OpImageSparseSampleImplicitLod:
	case OpImageSparseSampleExplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSparseSampleProjImplicitLod:
	case OpImageSparseSampleProjExplicitLod:
	case OpImageFetch:
	case OpImageSparseFetch:
	case OpImageRead:
	case OpImageSparseRead:
		for (uint32_t i = 1; i < length; i++)
		{
			// Argument 4 is a literal.
			if (i != 4)
				notify_variable_access(args[i], current_block->self);
		}
		break;

	case OpImageSampleDrefImplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSparseSampleDrefImplicitLod:
	case OpImageSparseSampleDrefExplicitLod:
	case OpImageSampleProjDrefImplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSparseSampleProjDrefImplicitLod:
	case OpImageSparseSampleProjDrefExplicitLod:
	case OpImageGather:
	case OpImageSparseGather:
	case OpImageDrefGather:
	case OpImageSparseDrefGather:
		for (uint32_t i = 1; i < length; i++)
		{
			// Argument 5 is a literal.
			if (i != 5)
				notify_variable_access(args[i], current_block->self);
		}
		break;

	default:
	{
		// Rather dirty way of figuring out where Phi variables are used.
		// As long as only IDs are used, we can scan through instructions and try to find any evidence that
		// the ID of a variable has been used.
		// There are potential false positives here where a literal is used in-place of an ID,
		// but worst case, it does not affect the correctness of the compile.
		// Exhaustive analysis would be better here, but it's not worth it for now.
		for (uint32_t i = 0; i < length; i++)
			notify_variable_access(args[i], current_block->self);
		break;
	}
	}
	return true;
}